

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O3

void Ssc_GiaResetSimInfo(Gia_Man_t *p)

{
  int iVar1;
  Vec_Wrd_t *pVVar2;
  word *pwVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  
  iVar5 = p->vSimsPi->nSize;
  iVar1 = p->vCis->nSize;
  if (iVar5 % iVar1 != 0) {
    __assert_fail("Vec_WrdSize(p->vSimsPi) % Gia_ManCiNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssc/sscSim.c"
                  ,0xf2,"void Ssc_GiaResetSimInfo(Gia_Man_t *)");
  }
  pVVar2 = p->vSims;
  if (pVVar2 == (Vec_Wrd_t *)0x0) {
    pVVar2 = (Vec_Wrd_t *)calloc(1,0x10);
    p->vSims = pVVar2;
    iVar4 = 0;
  }
  else {
    iVar4 = pVVar2->nCap;
  }
  uVar6 = (long)(iVar5 / (iVar1 - p->nRegs)) * (long)p->nObjs;
  iVar5 = (int)uVar6;
  if (iVar4 < iVar5) {
    if (pVVar2->pArray == (word *)0x0) {
      pwVar3 = (word *)malloc(uVar6 * 8);
    }
    else {
      pwVar3 = (word *)realloc(pVVar2->pArray,uVar6 * 8);
    }
    pVVar2->pArray = pwVar3;
    if (pwVar3 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    pVVar2->nCap = iVar5;
  }
  if (0 < iVar5) {
    memset(pVVar2->pArray,0,(uVar6 & 0xffffffff) << 3);
  }
  pVVar2->nSize = iVar5;
  return;
}

Assistant:

void Ssc_GiaResetSimInfo( Gia_Man_t * p )
{
    assert( Vec_WrdSize(p->vSimsPi) % Gia_ManCiNum(p) == 0 );
    if ( p->vSims == NULL )
        p->vSims = Vec_WrdAlloc(0);
    Vec_WrdFill( p->vSims, Gia_ObjSimWords(p) * Gia_ManObjNum(p), 0 );
}